

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbiftad.cpp
# Opt level: O2

void CVmBifTADS::toIntOrNum(uint argc,int int_only)

{
  vm_val_t *val_00;
  uint uVar1;
  vm_val_t *pvVar2;
  int iVar3;
  int32_t iVar4;
  vm_datatype_t vVar5;
  ushort *puVar6;
  ulong uVar7;
  ushort *__s1;
  long lVar8;
  long lVar9;
  vm_val_t val;
  
  CVmBif::check_argc_range(argc,1,2);
  pvVar2 = sp_;
  vVar5 = sp_[-1].typ;
  if (vVar5 == VM_OBJ) {
    val_00 = sp_ + -1;
    iVar3 = CVmObjBigNum::is_bignum_obj(sp_[-1].val.obj);
    if (iVar3 == 0) {
      vVar5 = val_00->typ;
      goto LAB_00253602;
    }
    if (int_only == 0) {
      CVmBif::retval(val_00);
      goto LAB_00253623;
    }
    uVar1 = pvVar2[-1].val.obj;
    iVar4 = CVmObjBigNum::convert_to_int
                      ((CVmObjBigNum *)(G_obj_table_X.pages_[uVar1 >> 0xc] + (uVar1 & 0xfff)));
    uVar7 = (ulong)iVar4;
  }
  else {
LAB_00253602:
    if (vVar5 - VM_NIL < 2) {
      uVar7 = (ulong)(vVar5 == VM_TRUE);
    }
    else {
      if (vVar5 != VM_INT) {
        puVar6 = (ushort *)vm_val_t::get_as_string(sp_ + -1);
        if (puVar6 == (ushort *)0x0) {
          err_throw(0x7e3);
        }
        uVar7 = (ulong)*puVar6;
        if (argc < 2) {
          iVar4 = 10;
        }
        else {
          iVar4 = vm_val_t::num_to_int(sp_ + -2);
          if (iVar4 - 0x25U < 0xffffffdd) {
            err_throw(0x902);
          }
        }
        lVar8 = -uVar7;
        __s1 = puVar6 + 1;
        while ((lVar8 != 0 && (iVar3 = is_space((int)(char)*__s1), iVar3 != 0))) {
          __s1 = (ushort *)((long)__s1 + 1);
          lVar8 = lVar8 + 1;
        }
        for (lVar9 = 0; lVar8 != lVar9; lVar9 = lVar9 + -1) {
          iVar3 = is_space((int)*(char *)((long)puVar6 + lVar9 + uVar7 + 1));
          if (iVar3 == 0) {
            if (lVar9 - lVar8 == 4) {
              if (*(int *)__s1 != 0x65757274) break;
              lVar8 = 1;
            }
            else {
              if ((lVar9 - lVar8 != 3) || (iVar3 = bcmp(__s1,"nil",3), iVar3 != 0)) break;
              lVar8 = 0;
            }
            CVmBif::retval_int(lVar8);
            goto LAB_00253623;
          }
        }
        CVmObjString::parse_num_val(&val,(char *)(puVar6 + 1),uVar7,iVar4,int_only);
        CVmBif::retval(&val);
        goto LAB_00253623;
      }
      uVar7 = (ulong)pvVar2[-1].val.intval;
    }
  }
  CVmBif::retval_int(uVar7);
LAB_00253623:
  sp_ = sp_ + -(long)(int)argc;
  return;
}

Assistant:

void CVmBifTADS::toIntOrNum(VMG_ uint argc, int int_only)
{    
    /* check arguments */
    check_argc_range(vmg_ argc, 1, 2);

    /* check for BigNumber values */
    vm_val_t *valp = G_stk->get(0);
    if (valp->typ == VM_OBJ
        && CVmObjBigNum::is_bignum_obj(vmg_ valp->val.obj))
    {
        /*
         *   If we only want integer results, try converting the BigNumber to
         *   an integer.  Otherwise, simply return the BigNumber as-is. 
         */
        if (int_only)
        {
            /* we only want an integer result - convert to int */
            long intval = ((CVmObjBigNum *)vm_objp(vmg_ valp->val.obj))
                          ->convert_to_int();

            /* return the integer value */
            retval_int(vmg_ intval);
        }
        else
        {
            /* BigNumber results are okay - just return the BigNumber */
            retval(vmg_ valp);
        }
        
        /* discard arguments, and we're done */
        G_stk->discard(argc);
        return;
    }

    /* if it's already an integer, just return the same value */
    if (valp->typ == VM_INT)
    {
        /* just return the argument value */
        retval_int(vmg_ valp->val.intval);

        /* discard arguments and return */
        G_stk->discard(argc);
        return;
    }

    /* if it's true or nil, convert to 1 or 0 */
    if (valp->typ == VM_TRUE || valp->typ == VM_NIL)
    {
        /* return 1 for true, 0 for nil */
        retval_int(vmg_ valp->typ == VM_TRUE ? 1 : 0);
        G_stk->discard(argc);
        return;
    }

    /* the only other type of value we can convert is a string */
    const char *strp = G_stk->get(0)->get_as_string(vmg0_);
    if (strp == 0)
        err_throw(VMERR_STRING_VAL_REQD);

    /* get the string length and buffer pointer */
    size_t len = vmb_get_len(strp);
    strp += VMB_LEN;

    /* if there's a radix specified, pop it as well; the default is 10 */
    int radix = 10;
    if (argc >= 2)
    {
        /* get the radix from the stack */
        radix = G_stk->get(1)->num_to_int(vmg0_);

        /* make sure it's in the valid range */
        if (radix < 2 || radix > 36)
            err_throw(VMERR_BAD_VAL_BIF);
    }

    /* get a version of the string stripped of leading and trailing spaces */
    const char *p2 = strp;
    size_t len2 = len;
    for ( ; len2 != 0 && is_space(*p2) ; ++p2, --len2) ;
    for ( ; len2 != 0 && is_space(*(p2 + len2 - 1)) ; --len2) ;

    /* 
     *   Check for "nil" and "true", ignoring leading and trailing spaces; if
     *   it matches either of those, return the corresponding boolean value.
     *   Otherwise, parse the string as an integer value in the given radix.
     */
    if (len2 == 3 && memcmp(p2, "nil", 3) == 0)
    {
        /* the value for "nil" is 0 */
        retval_int(vmg_ 0);
    }
    else if (len2 == 4 && memcmp(p2, "true", 4) == 0)
    {
        /* the value for "true" is 1 */
        retval_int(vmg_ 1);
    }
    else
    {
        /* parse the string as an integer (orBigNumber if it's too large) */
        vm_val_t val;
        CVmObjString::parse_num_val(vmg_ &val, strp, len, radix, int_only);
        retval(vmg_ &val);
    }

    /* discard arguments */
    G_stk->discard(argc);
}